

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O0

void jpeg_idct_15x15(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  JSAMPLE *pJVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  JSAMPROW pJVar21;
  JSAMPLE local_2d8 [4];
  int local_2d4;
  int workspace [120];
  int ctr;
  JSAMPLE *range_limit;
  JSAMPROW outptr;
  int *wsptr;
  ISLOW_MULT_TYPE *quantptr;
  JCOEFPTR inptr;
  INT32 z4;
  INT32 z3;
  INT32 z2;
  INT32 z1;
  INT32 tmp27;
  INT32 tmp26;
  INT32 tmp25;
  INT32 tmp24;
  INT32 tmp23;
  INT32 tmp22;
  INT32 tmp21;
  INT32 tmp20;
  INT32 tmp16;
  INT32 tmp15;
  INT32 tmp14;
  INT32 tmp13;
  INT32 tmp12;
  INT32 tmp11;
  INT32 tmp10;
  JDIMENSION output_col_local;
  JSAMPARRAY output_buf_local;
  JCOEFPTR coef_block_local;
  jpeg_component_info *compptr_local;
  j_decompress_ptr cinfo_local;
  
  pJVar1 = cinfo->sample_range_limit;
  wsptr = (int *)compptr->dct_table;
  outptr = local_2d8;
  quantptr = (ISLOW_MULT_TYPE *)coef_block;
  for (workspace[0x77] = 0; workspace[0x77] < 8; workspace[0x77] = workspace[0x77] + 1) {
    lVar2 = (long)((int)(short)*quantptr * *wsptr) * 0x2000 + 0x400;
    lVar3 = (long)((int)(short)quantptr[8] * wsptr[0x10]);
    lVar4 = (long)((int)(short)quantptr[0x10] * wsptr[0x20]);
    lVar5 = (long)((int)(short)quantptr[0x18] * wsptr[0x30]);
    lVar6 = lVar2 + lVar5 * -0xdfc;
    lVar7 = lVar2 + lVar5 * 0x249d;
    lVar2 = lVar2 + lVar5 * -0x2d42;
    lVar5 = lVar3 - lVar4;
    lVar4 = lVar3 + lVar4;
    lVar8 = lVar7 + lVar4 * 0x2ace + lVar5 * 0x176;
    lVar9 = lVar6 + lVar4 * -0x2ace + lVar5 * 0x176 + lVar3 * 0x2e13;
    lVar10 = lVar7 + lVar4 * -0x1182 + lVar5 * -0xcc7;
    lVar3 = lVar6 + lVar4 * 0x1182 + lVar5 * -0xcc7 + lVar3 * -0x2e13;
    lVar6 = lVar6 + lVar4 * 0x194c + lVar5 * 0xb50;
    lVar7 = lVar7 + lVar4 * -0x194c + lVar5 * 0xb50;
    lVar4 = lVar2 + lVar5 * 0x16a0;
    lVar11 = (long)((int)(short)quantptr[4] * wsptr[8]);
    lVar12 = (long)((int)(short)quantptr[0xc] * wsptr[0x18]);
    lVar13 = (long)((int)(short)quantptr[0x14] * wsptr[0x28]);
    lVar14 = (long)((int)(short)quantptr[0x1c] * wsptr[0x38]);
    lVar15 = (lVar11 + (lVar12 - lVar14)) * 0x1a9a;
    lVar16 = lVar15 + lVar11 * 0x1071;
    lVar15 = lVar15 + (lVar12 - lVar14) * -0x45a4;
    lVar17 = lVar13 * 0x2731 + (lVar11 - lVar14) * 0x2d02;
    lVar18 = lVar17 + lVar14 * 0x4ea3 + lVar12 * 0x2b0a;
    lVar17 = lVar17 + lVar11 * -0x2399 + lVar12 * -0x1a9a;
    lVar19 = (lVar11 - lVar14) * 0x2731 + lVar13 * -0x2731;
    lVar20 = (lVar11 + lVar14) * 0x1268;
    lVar11 = lVar20 + lVar11 * 0xf39 + lVar13 * -0x2731 + lVar12 * -0x1a9a;
    lVar12 = lVar20 + lVar14 * -0x1bd1 + lVar13 * 0x2731 + lVar12 * -0x2b0a;
    *(int *)outptr = (int)(lVar8 + lVar18 >> 0xb);
    *(int *)(outptr + 0x1c0) = (int)(lVar8 - lVar18 >> 0xb);
    *(int *)(outptr + 0x20) = (int)(lVar6 + lVar16 >> 0xb);
    *(int *)(outptr + 0x1a0) = (int)(lVar6 - lVar16 >> 0xb);
    *(int *)(outptr + 0x40) = (int)(lVar4 + lVar19 >> 0xb);
    *(int *)(outptr + 0x180) = (int)(lVar4 - lVar19 >> 0xb);
    *(int *)(outptr + 0x60) = (int)(lVar9 + lVar11 >> 0xb);
    *(int *)(outptr + 0x160) = (int)(lVar9 - lVar11 >> 0xb);
    *(int *)(outptr + 0x80) = (int)(lVar7 + lVar15 >> 0xb);
    *(int *)(outptr + 0x140) = (int)(lVar7 - lVar15 >> 0xb);
    *(int *)(outptr + 0xa0) = (int)(lVar10 + lVar12 >> 0xb);
    *(int *)(outptr + 0x120) = (int)(lVar10 - lVar12 >> 0xb);
    *(int *)(outptr + 0xc0) = (int)(lVar3 + lVar17 >> 0xb);
    *(int *)(outptr + 0x100) = (int)(lVar3 - lVar17 >> 0xb);
    *(int *)(outptr + 0xe0) = (int)(lVar2 + lVar5 * -0x16a0 + lVar5 * -0x16a0 >> 0xb);
    quantptr = (ISLOW_MULT_TYPE *)((long)quantptr + 2);
    wsptr = wsptr + 1;
    outptr = outptr + 4;
  }
  outptr = local_2d8;
  for (workspace[0x77] = 0; workspace[0x77] < 0xf; workspace[0x77] = workspace[0x77] + 1) {
    pJVar21 = output_buf[workspace[0x77]] + output_col;
    lVar2 = ((long)*(int *)outptr + 0x10) * 0x2000;
    lVar3 = (long)*(int *)(outptr + 8);
    lVar5 = (long)*(int *)(outptr + 0x18);
    lVar6 = lVar2 + lVar5 * -0xdfc;
    lVar7 = lVar2 + lVar5 * 0x249d;
    lVar2 = lVar2 + lVar5 * -0x2d42;
    lVar5 = lVar3 - *(int *)(outptr + 0x10);
    lVar4 = lVar3 + *(int *)(outptr + 0x10);
    lVar8 = lVar7 + lVar4 * 0x2ace + lVar5 * 0x176;
    lVar9 = lVar6 + lVar4 * -0x2ace + lVar5 * 0x176 + lVar3 * 0x2e13;
    lVar10 = lVar7 + lVar4 * -0x1182 + lVar5 * -0xcc7;
    lVar3 = lVar6 + lVar4 * 0x1182 + lVar5 * -0xcc7 + lVar3 * -0x2e13;
    lVar6 = lVar6 + lVar4 * 0x194c + lVar5 * 0xb50;
    lVar7 = lVar7 + lVar4 * -0x194c + lVar5 * 0xb50;
    lVar4 = lVar2 + lVar5 * 0x16a0;
    lVar11 = (long)*(int *)(outptr + 4);
    lVar12 = (long)*(int *)(outptr + 0xc);
    lVar13 = (long)*(int *)(outptr + 0x14);
    lVar14 = (long)*(int *)(outptr + 0x1c);
    lVar15 = (lVar11 + (lVar12 - lVar14)) * 0x1a9a;
    lVar16 = lVar15 + lVar11 * 0x1071;
    lVar15 = lVar15 + (lVar12 - lVar14) * -0x45a4;
    lVar17 = lVar13 * 0x2731 + (lVar11 - lVar14) * 0x2d02;
    lVar18 = lVar17 + lVar14 * 0x4ea3 + lVar12 * 0x2b0a;
    lVar17 = lVar17 + lVar11 * -0x2399 + lVar12 * -0x1a9a;
    lVar19 = (lVar11 - lVar14) * 0x2731 + lVar13 * -0x2731;
    lVar20 = (lVar11 + lVar14) * 0x1268;
    lVar11 = lVar20 + lVar11 * 0xf39 + lVar13 * -0x2731 + lVar12 * -0x1a9a;
    lVar12 = lVar20 + lVar14 * -0x1bd1 + lVar13 * 0x2731 + lVar12 * -0x2b0a;
    *pJVar21 = pJVar1[(long)(int)((uint)(lVar8 + lVar18 >> 0x12) & 0x3ff) + 0x80];
    pJVar21[0xe] = pJVar1[(long)(int)((uint)(lVar8 - lVar18 >> 0x12) & 0x3ff) + 0x80];
    pJVar21[1] = pJVar1[(long)(int)((uint)(lVar6 + lVar16 >> 0x12) & 0x3ff) + 0x80];
    pJVar21[0xd] = pJVar1[(long)(int)((uint)(lVar6 - lVar16 >> 0x12) & 0x3ff) + 0x80];
    pJVar21[2] = pJVar1[(long)(int)((uint)(lVar4 + lVar19 >> 0x12) & 0x3ff) + 0x80];
    pJVar21[0xc] = pJVar1[(long)(int)((uint)(lVar4 - lVar19 >> 0x12) & 0x3ff) + 0x80];
    pJVar21[3] = pJVar1[(long)(int)((uint)(lVar9 + lVar11 >> 0x12) & 0x3ff) + 0x80];
    pJVar21[0xb] = pJVar1[(long)(int)((uint)(lVar9 - lVar11 >> 0x12) & 0x3ff) + 0x80];
    pJVar21[4] = pJVar1[(long)(int)((uint)(lVar7 + lVar15 >> 0x12) & 0x3ff) + 0x80];
    pJVar21[10] = pJVar1[(long)(int)((uint)(lVar7 - lVar15 >> 0x12) & 0x3ff) + 0x80];
    pJVar21[5] = pJVar1[(long)(int)((uint)(lVar10 + lVar12 >> 0x12) & 0x3ff) + 0x80];
    pJVar21[9] = pJVar1[(long)(int)((uint)(lVar10 - lVar12 >> 0x12) & 0x3ff) + 0x80];
    pJVar21[6] = pJVar1[(long)(int)((uint)(lVar3 + lVar17 >> 0x12) & 0x3ff) + 0x80];
    pJVar21[8] = pJVar1[(long)(int)((uint)(lVar3 - lVar17 >> 0x12) & 0x3ff) + 0x80];
    pJVar21[7] = pJVar1[(long)(int)((uint)(lVar2 + lVar5 * -0x16a0 + lVar5 * -0x16a0 >> 0x12) &
                                   0x3ff) + 0x80];
    outptr = outptr + 0x20;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_15x15 (j_decompress_ptr cinfo, jpeg_component_info * compptr,
		 JCOEFPTR coef_block,
		 JSAMPARRAY output_buf, JDIMENSION output_col)
{
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14, tmp15, tmp16;
  INT32 tmp20, tmp21, tmp22, tmp23, tmp24, tmp25, tmp26, tmp27;
  INT32 z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE * quantptr;
  int * wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8*15];	/* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *) compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    z1 = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]);
    z1 <<= CONST_BITS;
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS-PASS1_BITS-1);

    z2 = DEQUANTIZE(inptr[DCTSIZE*2], quantptr[DCTSIZE*2]);
    z3 = DEQUANTIZE(inptr[DCTSIZE*4], quantptr[DCTSIZE*4]);
    z4 = DEQUANTIZE(inptr[DCTSIZE*6], quantptr[DCTSIZE*6]);

    tmp10 = MULTIPLY(z4, FIX(0.437016024)); /* c12 */
    tmp11 = MULTIPLY(z4, FIX(1.144122806)); /* c6 */

    tmp12 = z1 - tmp10;
    tmp13 = z1 + tmp11;
    z1 -= (tmp11 - tmp10) << 1;             /* c0 = (c6-c12)*2 */

    z4 = z2 - z3;
    z3 += z2;
    tmp10 = MULTIPLY(z3, FIX(1.337628990)); /* (c2+c4)/2 */
    tmp11 = MULTIPLY(z4, FIX(0.045680613)); /* (c2-c4)/2 */
    z2 = MULTIPLY(z2, FIX(1.439773946));    /* c4+c14 */

    tmp20 = tmp13 + tmp10 + tmp11;
    tmp23 = tmp12 - tmp10 + tmp11 + z2;

    tmp10 = MULTIPLY(z3, FIX(0.547059574)); /* (c8+c14)/2 */
    tmp11 = MULTIPLY(z4, FIX(0.399234004)); /* (c8-c14)/2 */

    tmp25 = tmp13 - tmp10 - tmp11;
    tmp26 = tmp12 + tmp10 - tmp11 - z2;

    tmp10 = MULTIPLY(z3, FIX(0.790569415)); /* (c6+c12)/2 */
    tmp11 = MULTIPLY(z4, FIX(0.353553391)); /* (c6-c12)/2 */

    tmp21 = tmp12 + tmp10 + tmp11;
    tmp24 = tmp13 - tmp10 + tmp11;
    tmp11 += tmp11;
    tmp22 = z1 + tmp11;                     /* c10 = c6-c12 */
    tmp27 = z1 - tmp11 - tmp11;             /* c0 = (c6-c12)*2 */

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE*1], quantptr[DCTSIZE*1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE*3], quantptr[DCTSIZE*3]);
    z4 = DEQUANTIZE(inptr[DCTSIZE*5], quantptr[DCTSIZE*5]);
    z3 = MULTIPLY(z4, FIX(1.224744871));                    /* c5 */
    z4 = DEQUANTIZE(inptr[DCTSIZE*7], quantptr[DCTSIZE*7]);

    tmp13 = z2 - z4;
    tmp15 = MULTIPLY(z1 + tmp13, FIX(0.831253876));         /* c9 */
    tmp11 = tmp15 + MULTIPLY(z1, FIX(0.513743148));         /* c3-c9 */
    tmp14 = tmp15 - MULTIPLY(tmp13, FIX(2.176250899));      /* c3+c9 */

    tmp13 = MULTIPLY(z2, - FIX(0.831253876));               /* -c9 */
    tmp15 = MULTIPLY(z2, - FIX(1.344997024));               /* -c3 */
    z2 = z1 - z4;
    tmp12 = z3 + MULTIPLY(z2, FIX(1.406466353));            /* c1 */

    tmp10 = tmp12 + MULTIPLY(z4, FIX(2.457431844)) - tmp15; /* c1+c7 */
    tmp16 = tmp12 - MULTIPLY(z1, FIX(1.112434820)) + tmp13; /* c1-c13 */
    tmp12 = MULTIPLY(z2, FIX(1.224744871)) - z3;            /* c5 */
    z2 = MULTIPLY(z1 + z4, FIX(0.575212477));               /* c11 */
    tmp13 += z2 + MULTIPLY(z1, FIX(0.475753014)) - z3;      /* c7-c11 */
    tmp15 += z2 - MULTIPLY(z4, FIX(0.869244010)) + z3;      /* c11+c13 */

    /* Final output stage */

    wsptr[8*0]  = (int) RIGHT_SHIFT(tmp20 + tmp10, CONST_BITS-PASS1_BITS);
    wsptr[8*14] = (int) RIGHT_SHIFT(tmp20 - tmp10, CONST_BITS-PASS1_BITS);
    wsptr[8*1]  = (int) RIGHT_SHIFT(tmp21 + tmp11, CONST_BITS-PASS1_BITS);
    wsptr[8*13] = (int) RIGHT_SHIFT(tmp21 - tmp11, CONST_BITS-PASS1_BITS);
    wsptr[8*2]  = (int) RIGHT_SHIFT(tmp22 + tmp12, CONST_BITS-PASS1_BITS);
    wsptr[8*12] = (int) RIGHT_SHIFT(tmp22 - tmp12, CONST_BITS-PASS1_BITS);
    wsptr[8*3]  = (int) RIGHT_SHIFT(tmp23 + tmp13, CONST_BITS-PASS1_BITS);
    wsptr[8*11] = (int) RIGHT_SHIFT(tmp23 - tmp13, CONST_BITS-PASS1_BITS);
    wsptr[8*4]  = (int) RIGHT_SHIFT(tmp24 + tmp14, CONST_BITS-PASS1_BITS);
    wsptr[8*10] = (int) RIGHT_SHIFT(tmp24 - tmp14, CONST_BITS-PASS1_BITS);
    wsptr[8*5]  = (int) RIGHT_SHIFT(tmp25 + tmp15, CONST_BITS-PASS1_BITS);
    wsptr[8*9]  = (int) RIGHT_SHIFT(tmp25 - tmp15, CONST_BITS-PASS1_BITS);
    wsptr[8*6]  = (int) RIGHT_SHIFT(tmp26 + tmp16, CONST_BITS-PASS1_BITS);
    wsptr[8*8]  = (int) RIGHT_SHIFT(tmp26 - tmp16, CONST_BITS-PASS1_BITS);
    wsptr[8*7]  = (int) RIGHT_SHIFT(tmp27, CONST_BITS-PASS1_BITS);
  }

  /* Pass 2: process 15 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 15; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    z1 = (INT32) wsptr[0] + (ONE << (PASS1_BITS+2));
    z1 <<= CONST_BITS;

    z2 = (INT32) wsptr[2];
    z3 = (INT32) wsptr[4];
    z4 = (INT32) wsptr[6];

    tmp10 = MULTIPLY(z4, FIX(0.437016024)); /* c12 */
    tmp11 = MULTIPLY(z4, FIX(1.144122806)); /* c6 */

    tmp12 = z1 - tmp10;
    tmp13 = z1 + tmp11;
    z1 -= (tmp11 - tmp10) << 1;             /* c0 = (c6-c12)*2 */

    z4 = z2 - z3;
    z3 += z2;
    tmp10 = MULTIPLY(z3, FIX(1.337628990)); /* (c2+c4)/2 */
    tmp11 = MULTIPLY(z4, FIX(0.045680613)); /* (c2-c4)/2 */
    z2 = MULTIPLY(z2, FIX(1.439773946));    /* c4+c14 */

    tmp20 = tmp13 + tmp10 + tmp11;
    tmp23 = tmp12 - tmp10 + tmp11 + z2;

    tmp10 = MULTIPLY(z3, FIX(0.547059574)); /* (c8+c14)/2 */
    tmp11 = MULTIPLY(z4, FIX(0.399234004)); /* (c8-c14)/2 */

    tmp25 = tmp13 - tmp10 - tmp11;
    tmp26 = tmp12 + tmp10 - tmp11 - z2;

    tmp10 = MULTIPLY(z3, FIX(0.790569415)); /* (c6+c12)/2 */
    tmp11 = MULTIPLY(z4, FIX(0.353553391)); /* (c6-c12)/2 */

    tmp21 = tmp12 + tmp10 + tmp11;
    tmp24 = tmp13 - tmp10 + tmp11;
    tmp11 += tmp11;
    tmp22 = z1 + tmp11;                     /* c10 = c6-c12 */
    tmp27 = z1 - tmp11 - tmp11;             /* c0 = (c6-c12)*2 */

    /* Odd part */

    z1 = (INT32) wsptr[1];
    z2 = (INT32) wsptr[3];
    z4 = (INT32) wsptr[5];
    z3 = MULTIPLY(z4, FIX(1.224744871));                    /* c5 */
    z4 = (INT32) wsptr[7];

    tmp13 = z2 - z4;
    tmp15 = MULTIPLY(z1 + tmp13, FIX(0.831253876));         /* c9 */
    tmp11 = tmp15 + MULTIPLY(z1, FIX(0.513743148));         /* c3-c9 */
    tmp14 = tmp15 - MULTIPLY(tmp13, FIX(2.176250899));      /* c3+c9 */

    tmp13 = MULTIPLY(z2, - FIX(0.831253876));               /* -c9 */
    tmp15 = MULTIPLY(z2, - FIX(1.344997024));               /* -c3 */
    z2 = z1 - z4;
    tmp12 = z3 + MULTIPLY(z2, FIX(1.406466353));            /* c1 */

    tmp10 = tmp12 + MULTIPLY(z4, FIX(2.457431844)) - tmp15; /* c1+c7 */
    tmp16 = tmp12 - MULTIPLY(z1, FIX(1.112434820)) + tmp13; /* c1-c13 */
    tmp12 = MULTIPLY(z2, FIX(1.224744871)) - z3;            /* c5 */
    z2 = MULTIPLY(z1 + z4, FIX(0.575212477));               /* c11 */
    tmp13 += z2 + MULTIPLY(z1, FIX(0.475753014)) - z3;      /* c7-c11 */
    tmp15 += z2 - MULTIPLY(z4, FIX(0.869244010)) + z3;      /* c11+c13 */

    /* Final output stage */

    outptr[0]  = range_limit[(int) RIGHT_SHIFT(tmp20 + tmp10,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[14] = range_limit[(int) RIGHT_SHIFT(tmp20 - tmp10,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[1]  = range_limit[(int) RIGHT_SHIFT(tmp21 + tmp11,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[13] = range_limit[(int) RIGHT_SHIFT(tmp21 - tmp11,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[2]  = range_limit[(int) RIGHT_SHIFT(tmp22 + tmp12,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[12] = range_limit[(int) RIGHT_SHIFT(tmp22 - tmp12,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[3]  = range_limit[(int) RIGHT_SHIFT(tmp23 + tmp13,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[11] = range_limit[(int) RIGHT_SHIFT(tmp23 - tmp13,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[4]  = range_limit[(int) RIGHT_SHIFT(tmp24 + tmp14,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[10] = range_limit[(int) RIGHT_SHIFT(tmp24 - tmp14,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[5]  = range_limit[(int) RIGHT_SHIFT(tmp25 + tmp15,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[9]  = range_limit[(int) RIGHT_SHIFT(tmp25 - tmp15,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[6]  = range_limit[(int) RIGHT_SHIFT(tmp26 + tmp16,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[8]  = range_limit[(int) RIGHT_SHIFT(tmp26 - tmp16,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];
    outptr[7]  = range_limit[(int) RIGHT_SHIFT(tmp27,
					       CONST_BITS+PASS1_BITS+3)
			     & RANGE_MASK];

    wsptr += 8;		/* advance pointer to next row */
  }
}